

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O0

void * operator_new(size_t size)

{
  void *pvVar1;
  bad_alloc *this;
  void *p;
  size_t size_local;
  
  pvVar1 = operator_new(size,(nothrow_t *)&std::nothrow);
  if (pvVar1 == (void *)0x0) {
    this = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this);
    __cxa_throw(this,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return pvVar1;
}

Assistant:

void* operator new(size_t size) GOOGLE_GLOG_THROW_BAD_ALLOC {
  void* p = ::operator new(size, std::nothrow);
  if (p == nullptr) {
    throw std::bad_alloc{};
  }
  return p;
}